

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O3

void __thiscall
mp::
RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
::ConvertWithRhs(RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
                 *this,ItemType *item,RangeRelations rr)

{
  SmallVec<int,_6> *pSVar1;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar2;
  QuadAndLinTerms *le;
  NodeRange NVar3;
  undefined1 local_ae0 [72];
  ptr local_a98;
  ulong local_a90;
  QuadTerms local_a68;
  undefined1 local_928 [72];
  ptr local_8e0;
  ulong local_8d8;
  QuadTerms local_8b0;
  undefined1 local_770 [72];
  ptr local_728;
  ulong local_720;
  QuadTerms local_6f8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> local_5b8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_3d8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> local_1f8;
  
  if (((uint3)rr._M_elems >> 8 & 1) == 0) {
    if (((uint3)rr._M_elems >> 0x10 & 1) == 0) {
      return;
    }
    pFVar2 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)(this->
                super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).mdl_cvt_;
    gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<double>,6u> *)local_928,
               &item->super_QuadAndLinTerms);
    gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<int>,6u> *)&local_8e0,
               &(item->super_QuadAndLinTerms).super_LinTerms.vars_);
    QuadTerms::QuadTerms(&local_8b0,&(item->super_QuadAndLinTerms).super_QuadTerms);
    le = (QuadAndLinTerms *)local_928;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_3d8,le,(AlgConRhs<_1>)(item->super_AlgConRange).ub_,true);
    NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::
            AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                      ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                        *)pFVar2,&local_3d8);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink(pFVar2,NVar3);
    if (6 < local_3d8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3d8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3d8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3d8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3d8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3d8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3d8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3d8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_3d8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_3d8.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_3d8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_3d8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_3d8.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3d8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3d8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3d8.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3d8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_3d8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.super_BasicConstraint.name_._M_dataplus._M_p !=
        &local_3d8.super_BasicConstraint.name_.field_2) {
      operator_delete(local_3d8.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_3d8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if (6 < local_8b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_8b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_8b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_8b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_8b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_8b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_8b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_8b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_8b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_8b0.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_8b0.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_8b0.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    local_ae0._8_8_ = local_928._8_8_;
    if (6 < local_8d8) {
      operator_delete(local_8e0,local_8d8 << 2);
      local_ae0._8_8_ = local_928._8_8_;
    }
  }
  else {
    pSVar1 = &(item->super_QuadAndLinTerms).super_LinTerms.vars_;
    pFVar2 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)(this->
                super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).mdl_cvt_;
    if (((uint3)rr._M_elems >> 0x10 & 1) == 0) {
      gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<double>,6u> *)local_770,
                 &item->super_QuadAndLinTerms);
      gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<int>,6u> *)&local_728,pSVar1);
      QuadTerms::QuadTerms(&local_6f8,&(item->super_QuadAndLinTerms).super_QuadTerms);
      le = (QuadAndLinTerms *)local_770;
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                (&local_1f8,le,(AlgConRhs<1>)(item->super_AlgConRange).lb_,true);
      NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                          *)pFVar2,&local_1f8);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AutoLink(pFVar2,NVar3);
      if (6 < local_1f8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_1f8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if (8 < local_1f8.super_QuadAndLinTerms.super_QuadTerms.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_capacity) {
        operator_delete(local_1f8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr,
                        local_1f8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_capacity << 4);
      }
      if (6 < local_1f8.super_QuadAndLinTerms.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f8.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1f8.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1f8.super_QuadAndLinTerms.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1f8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_1f8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_1f8.super_BasicConstraint.name_.field_2) {
        operator_delete(local_1f8.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_1f8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      if (6 < local_6f8.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_6f8.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_6f8.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_6f8.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_6f8.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_6f8.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_6f8.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_6f8.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                        m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_6f8.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                        m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3
                       );
      }
      if (8 < local_6f8.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_capacity) {
        operator_delete(local_6f8.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr,
                        local_6f8.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_capacity << 4);
      }
      local_ae0._8_8_ = local_770._8_8_;
      if (6 < local_720) {
        operator_delete(local_728,local_720 << 2);
        local_ae0._8_8_ = local_770._8_8_;
      }
    }
    else {
      gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<double>,6u> *)local_ae0,
                 &item->super_QuadAndLinTerms);
      gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<int>,6u> *)&local_a98,pSVar1);
      QuadTerms::QuadTerms(&local_a68,&(item->super_QuadAndLinTerms).super_QuadTerms);
      le = (QuadAndLinTerms *)local_ae0;
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
                (&local_5b8,le,
                 (AlgConRhs<0>)
                 (((item->super_AlgConRange).lb_ + (item->super_AlgConRange).ub_) * 0.5),true);
      NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                          *)pFVar2,&local_5b8);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AutoLink(pFVar2,NVar3);
      if (6 < local_5b8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_5b8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_5b8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_5b8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_5b8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_5b8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_5b8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_5b8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_5b8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if (8 < local_5b8.super_QuadAndLinTerms.super_QuadTerms.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_capacity) {
        operator_delete(local_5b8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr,
                        local_5b8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_capacity << 4);
      }
      if (6 < local_5b8.super_QuadAndLinTerms.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_5b8.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_5b8.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_5b8.super_QuadAndLinTerms.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_5b8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_5b8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_5b8.super_BasicConstraint.name_.field_2) {
        operator_delete(local_5b8.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_5b8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      if (6 < local_a68.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_a68.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_a68.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_a68.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_a68.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_a68.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_a68.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_a68.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                        m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_a68.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                        m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3
                       );
      }
      if (8 < local_a68.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_capacity) {
        operator_delete(local_a68.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr,
                        local_a68.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_capacity << 4);
      }
      if (6 < local_a90) {
        operator_delete(local_a98,local_a90 << 2);
      }
    }
  }
  if (6 < (ulong)local_ae0._8_8_) {
    operator_delete((le->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_ae0._8_8_ << 3);
  }
  return;
}

Assistant:

void ConvertWithRhs(const ItemType& item, RangeRelations rr) {
    if (rr[1] && !rr[2]) {
      GetMC().AddConstraint(
              AlgConGE( item.GetBody(), item.lb() ) );
    } else if (!rr[1] && rr[2]) {
      GetMC().AddConstraint(
              AlgConLE( item.GetBody(), item.ub() ) );
    } else if (rr[1] && rr[2]) {
      assert(item.lb()>=item.ub());
      GetMC().AddConstraint(
            AlgConEQ( item.GetBody(),
                      (item.lb()+item.ub()) / 2.0 ) );
    } // else, both are inf, forget
  }